

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O2

bool __thiscall
despot::option::Parser::StoreOptionAction::perform(StoreOptionAction *this,Option *option)

{
  Option *orig;
  int iVar1;
  uint uVar2;
  Option *pOVar3;
  
  iVar1 = this->parser->op_count;
  if (this->bufmax < 0) {
    if (iVar1 == 0x7fffffff) {
      return false;
    }
  }
  else if (this->bufmax <= iVar1) {
    return true;
  }
  Option::operator=(this->buffer + iVar1,option);
  pOVar3 = this->options;
  iVar1 = this->parser->op_count;
  orig = this->buffer + iVar1;
  uVar2 = (this->buffer[iVar1].desc)->index;
  if ((pOVar3 == (Option *)0x0) || (pOVar3[(int)uVar2].desc == (Descriptor *)0x0)) {
    Option::operator=(pOVar3 + (int)uVar2,orig);
  }
  else {
    Option::append(pOVar3 + (int)uVar2,orig);
  }
  this->parser->op_count = this->parser->op_count + 1;
  return true;
}

Assistant:

bool perform(Option& option) {
		if (bufmax < 0 || parser.op_count < bufmax) {
			if (parser.op_count == 0x7fffffff)
				return false; // overflow protection: don't accept number of options that doesn't fit signed int

			buffer[parser.op_count] = option;
			int idx = buffer[parser.op_count].desc->index;
			if (options[idx])
				options[idx].append(buffer[parser.op_count]);
			else
				options[idx] = buffer[parser.op_count];
			++parser.op_count;
		}
		return true; // NOTE: an option that is discarded because of a full buffer is not fatal
	}